

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O3

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,int param_3,
               byte param_4)

{
  long lVar1;
  ulong uVar2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  long lVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var11;
  int iVar12;
  int __tmp_8;
  int iVar13;
  int *piVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  pair<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>,_bool> pVar19;
  _Iter_comp_iter<std::less<int>_> __cmp;
  _Iter_comp_iter<std::less<int>_> __cmp_1;
  _Iter_comp_iter<std::less<int>_> local_36;
  _Iter_comp_iter<std::less<int>_> local_35;
  int local_34;
  
  uVar16 = (long)end._M_current - (long)begin._M_current >> 2;
  if ((long)uVar16 < 0x18) {
    piVar5 = begin._M_current;
    if (param_4 == 0) {
LAB_00279290:
      piVar4 = piVar5 + 1;
      if (piVar5 + 1 == end._M_current || piVar5 == end._M_current) {
        return;
      }
      do {
        piVar9 = piVar4;
        iVar12 = *piVar5;
        iVar7 = piVar5[1];
        piVar5 = piVar9;
        if (iVar7 < iVar12) {
          do {
            *piVar5 = iVar12;
            iVar12 = piVar5[-2];
            piVar5 = piVar5 + -1;
          } while (iVar7 < iVar12);
          *piVar5 = iVar7;
        }
        piVar4 = piVar9 + 1;
        piVar5 = piVar9;
      } while (piVar9 + 1 != end._M_current);
      return;
    }
  }
  else {
    do {
      uVar2 = uVar16 >> 1;
      if (uVar16 < 0x81) {
        iVar7 = *begin._M_current;
        iVar12 = begin._M_current[uVar2];
        if (iVar7 < iVar12) {
          begin._M_current[uVar2] = iVar7;
          *begin._M_current = iVar12;
          iVar7 = iVar12;
        }
        if (end._M_current[-1] < iVar7) {
          *begin._M_current = end._M_current[-1];
          end._M_current[-1] = iVar7;
          iVar7 = *begin._M_current;
        }
        iVar12 = begin._M_current[uVar2];
        if (iVar7 < iVar12) {
          begin._M_current[uVar2] = iVar7;
          *begin._M_current = iVar12;
        }
      }
      else {
        iVar7 = begin._M_current[uVar2];
        iVar12 = *begin._M_current;
        if (iVar7 < iVar12) {
          *begin._M_current = iVar7;
          begin._M_current[uVar2] = iVar12;
          iVar7 = iVar12;
        }
        if (end._M_current[-1] < iVar7) {
          begin._M_current[uVar2] = end._M_current[-1];
          end._M_current[-1] = iVar7;
          iVar7 = begin._M_current[uVar2];
        }
        iVar12 = *begin._M_current;
        if (iVar7 < iVar12) {
          *begin._M_current = iVar7;
          begin._M_current[uVar2] = iVar12;
        }
        iVar7 = begin._M_current[uVar2 - 1];
        iVar12 = begin._M_current[1];
        if (iVar7 < iVar12) {
          begin._M_current[1] = iVar7;
          begin._M_current[uVar2 - 1] = iVar12;
          iVar7 = iVar12;
        }
        if (end._M_current[-2] < iVar7) {
          begin._M_current[uVar2 - 1] = end._M_current[-2];
          end._M_current[-2] = iVar7;
          iVar7 = begin._M_current[uVar2 - 1];
        }
        iVar12 = begin._M_current[1];
        if (iVar7 < iVar12) {
          begin._M_current[1] = iVar7;
          begin._M_current[uVar2 - 1] = iVar12;
        }
        iVar7 = begin._M_current[uVar2 + 1];
        iVar12 = begin._M_current[2];
        if (iVar7 < iVar12) {
          begin._M_current[2] = iVar7;
          begin._M_current[uVar2 + 1] = iVar12;
          iVar7 = iVar12;
        }
        if (end._M_current[-3] < iVar7) {
          begin._M_current[uVar2 + 1] = end._M_current[-3];
          end._M_current[-3] = iVar7;
          iVar7 = begin._M_current[uVar2 + 1];
        }
        iVar12 = begin._M_current[2];
        if (iVar7 < iVar12) {
          begin._M_current[2] = iVar7;
          begin._M_current[uVar2 + 1] = iVar12;
          iVar7 = iVar12;
        }
        iVar8 = begin._M_current[uVar2 - 1];
        iVar12 = begin._M_current[uVar2];
        iVar13 = iVar12;
        if (iVar12 < iVar8) {
          begin._M_current[uVar2 - 1] = iVar12;
          begin._M_current[uVar2] = iVar8;
          iVar13 = iVar8;
          iVar8 = iVar12;
        }
        if (iVar7 < iVar13) {
          begin._M_current[uVar2] = iVar7;
          begin._M_current[uVar2 + 1] = iVar13;
          iVar13 = iVar7;
        }
        if (iVar13 < iVar8) {
          begin._M_current[uVar2 - 1] = iVar13;
          begin._M_current[uVar2] = iVar8;
          iVar13 = iVar8;
        }
        iVar7 = *begin._M_current;
        *begin._M_current = iVar13;
        begin._M_current[uVar2] = iVar7;
      }
      if (((param_4 & 1) == 0) && (iVar7 = *begin._M_current, iVar7 <= begin._M_current[-1])) {
        lVar1 = 0;
        do {
          iVar12 = *(end._M_current + lVar1 + -4);
          lVar1 = lVar1 + -4;
        } while (iVar7 < iVar12);
        piVar5 = end._M_current + lVar1;
        _Var3._M_current = begin._M_current;
        iVar8 = iVar7;
        if (lVar1 == -4) {
          do {
            if (piVar5 <= _Var3._M_current) break;
            _Var3._M_current = _Var3._M_current + 1;
            iVar8 = *_Var3._M_current;
          } while (iVar8 <= iVar7);
        }
        else {
          do {
            iVar8 = _Var3._M_current[1];
            _Var3._M_current = _Var3._M_current + 1;
          } while (iVar8 <= iVar7);
        }
        while (_Var3._M_current < piVar5) {
          *_Var3._M_current = iVar12;
          *piVar5 = iVar8;
          do {
            iVar12 = piVar5[-1];
            piVar5 = piVar5 + -1;
          } while (iVar7 < iVar12);
          do {
            iVar8 = _Var3._M_current[1];
            _Var3._M_current = _Var3._M_current + 1;
          } while (iVar8 <= iVar7);
        }
        *begin._M_current = iVar12;
        *piVar5 = iVar7;
        piVar5 = piVar5 + 1;
        uVar16 = (long)end._M_current - (long)piVar5 >> 2;
      }
      else {
        pVar19 = partition_right_branchless<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>>
                           (begin._M_current,end._M_current);
        _Var3 = pVar19.first._M_current;
        uVar2 = (long)_Var3._M_current - (long)begin._M_current >> 2;
        piVar5 = _Var3._M_current + 1;
        uVar18 = (long)end._M_current - (long)piVar5 >> 2;
        if (((long)uVar2 < (long)(uVar16 >> 3)) || ((long)uVar18 < (long)(uVar16 >> 3))) {
          param_3 = param_3 + -1;
          if (param_3 == 0) {
            std::
            __make_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,&local_36);
            std::
            __sort_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<int>>>
                      (begin,end,&local_35);
            return;
          }
          if (0x17 < (long)uVar2) {
            uVar16 = uVar2 & 0xfffffffffffffffc;
            iVar7 = *begin._M_current;
            *begin._M_current = *(begin._M_current + uVar16);
            *(begin._M_current + uVar16) = iVar7;
            iVar7 = _Var3._M_current[-1];
            _Var3._M_current[-1] = *(_Var3._M_current - uVar16);
            *(_Var3._M_current - uVar16) = iVar7;
            if (0x80 < uVar2) {
              uVar2 = uVar2 >> 2;
              iVar7 = begin._M_current[1];
              begin._M_current[1] = begin._M_current[uVar2 + 1];
              begin._M_current[uVar2 + 1] = iVar7;
              iVar7 = begin._M_current[2];
              begin._M_current[2] = begin._M_current[uVar2 + 2];
              begin._M_current[uVar2 + 2] = iVar7;
              iVar7 = _Var3._M_current[-2];
              _Var3._M_current[-2] = _Var3._M_current[~uVar2];
              _Var3._M_current[~uVar2] = iVar7;
              iVar7 = _Var3._M_current[-3];
              _Var3._M_current[-3] = _Var3._M_current[-2 - uVar2];
              _Var3._M_current[-2 - uVar2] = iVar7;
            }
          }
          if (0x17 < (long)uVar18) {
            uVar16 = uVar18 & 0xfffffffffffffffc;
            iVar7 = _Var3._M_current[1];
            _Var3._M_current[1] = *(_Var3._M_current + uVar16 + 4);
            *(_Var3._M_current + uVar16 + 4) = iVar7;
            iVar7 = end._M_current[-1];
            end._M_current[-1] = *(end._M_current - uVar16);
            *(end._M_current - uVar16) = iVar7;
            if (0x80 < uVar18) {
              uVar16 = uVar18 >> 2;
              iVar7 = _Var3._M_current[2];
              _Var3._M_current[2] = _Var3._M_current[uVar16 + 2];
              _Var3._M_current[uVar16 + 2] = iVar7;
              iVar7 = _Var3._M_current[3];
              _Var3._M_current[3] = _Var3._M_current[uVar16 + 3];
              _Var3._M_current[uVar16 + 3] = iVar7;
              iVar7 = end._M_current[-2];
              end._M_current[-2] = end._M_current[~uVar16];
              end._M_current[~uVar16] = iVar7;
              iVar7 = end._M_current[-3];
              end._M_current[-3] = end._M_current[-2 - uVar16];
              end._M_current[-2 - uVar16] = iVar7;
            }
          }
        }
        else if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (begin._M_current + 1 != _Var3._M_current && begin._M_current != _Var3._M_current) {
            lVar1 = 4;
            uVar16 = 0;
            _Var11._M_current = begin._M_current;
            piVar4 = begin._M_current + 1;
            do {
              iVar12 = *_Var11._M_current;
              iVar7 = _Var11._M_current[1];
              lVar10 = lVar1;
              if (iVar7 < iVar12) {
                do {
                  *(begin._M_current + lVar10) = iVar12;
                  _Var11._M_current = begin._M_current;
                  if (lVar10 == 4) goto LAB_00278fe5;
                  iVar12 = *(begin._M_current + lVar10 + -8);
                  lVar10 = lVar10 + -4;
                } while (iVar7 < iVar12);
                _Var11._M_current = lVar10 + begin._M_current;
LAB_00278fe5:
                *_Var11._M_current = iVar7;
                uVar16 = uVar16 + ((long)piVar4 - (long)_Var11._M_current >> 2);
                if (8 < uVar16) goto LAB_00279261;
              }
              piVar9 = piVar4 + 1;
              lVar1 = lVar1 + 4;
              _Var11._M_current = piVar4;
              piVar4 = piVar9;
            } while (piVar9 != _Var3._M_current);
          }
          if (piVar5 == end._M_current) {
            return;
          }
          piVar4 = _Var3._M_current + 2;
          if (piVar4 == end._M_current) {
            return;
          }
          lVar1 = 8;
          lVar10 = 0;
          uVar16 = 0;
          piVar9 = piVar5;
          do {
            iVar12 = *piVar9;
            piVar9 = _Var3._M_current + lVar1;
            iVar7 = *(_Var3._M_current + lVar1);
            piVar14 = piVar4;
            lVar17 = lVar10;
            if (iVar7 < iVar12) {
              do {
                *piVar14 = iVar12;
                piVar6 = piVar5;
                piVar15 = piVar5;
                if (lVar17 == 0) goto LAB_00279074;
                iVar12 = piVar14[-2];
                piVar14 = piVar14 + -1;
                lVar17 = lVar17 + 4;
              } while (iVar7 < iVar12);
              piVar6 = _Var3._M_current + (8 - lVar17);
              piVar15 = piVar14;
LAB_00279074:
              *piVar15 = iVar7;
              uVar16 = uVar16 + ((long)piVar9 - (long)piVar6 >> 2);
              local_34 = param_3;
              if (8 < uVar16) break;
            }
            lVar17 = lVar1 + 4;
            lVar1 = lVar1 + 4;
            piVar4 = piVar4 + 1;
            lVar10 = lVar10 + -4;
            if (_Var3._M_current + lVar17 == end._M_current) {
              return;
            }
          } while( true );
        }
LAB_00279261:
        pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::less<int>,true>
                  (begin._M_current,_Var3._M_current,param_3);
        param_4 = 0;
        uVar16 = uVar18;
      }
      begin._M_current = piVar5;
    } while (0x17 < (long)uVar16);
    if ((param_4 & 1) == 0) goto LAB_00279290;
  }
  if (piVar5 + 1 != end._M_current && piVar5 != end._M_current) {
    lVar1 = 4;
    piVar4 = piVar5;
    piVar9 = piVar5 + 1;
    do {
      iVar12 = *piVar4;
      iVar7 = piVar4[1];
      lVar10 = lVar1;
      if (iVar7 < iVar12) {
        do {
          *(int *)((long)piVar5 + lVar10) = iVar12;
          piVar4 = piVar5;
          if (lVar10 == 4) goto LAB_00278dba;
          iVar12 = *(int *)((long)piVar5 + lVar10 + -8);
          lVar10 = lVar10 + -4;
        } while (iVar7 < iVar12);
        piVar4 = (int *)(lVar10 + (long)piVar5);
LAB_00278dba:
        *piVar4 = iVar7;
      }
      piVar14 = piVar9 + 1;
      lVar1 = lVar1 + 4;
      piVar4 = piVar9;
      piVar9 = piVar14;
    } while (piVar14 != end._M_current);
  }
  return;
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }